

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O1

void __thiscall
llvm::DWARFVerifier::DWARFVerifier
          (DWARFVerifier *this,raw_ostream *S,DWARFContext *D,DIDumpOptions DumpOpts)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  
  this->OS = S;
  this->DCtx = D;
  (this->DumpOpts).DumpType = DumpOpts.DumpType;
  (this->DumpOpts).ChildRecurseDepth = DumpOpts.ChildRecurseDepth;
  (this->DumpOpts).ParentRecurseDepth = DumpOpts.ParentRecurseDepth;
  (this->DumpOpts).Version = DumpOpts.Version;
  (this->DumpOpts).AddrSize = DumpOpts.AddrSize;
  (this->DumpOpts).ShowAddresses = DumpOpts.ShowAddresses;
  (this->DumpOpts).ShowChildren = DumpOpts.ShowChildren;
  (this->DumpOpts).ShowParents = DumpOpts.ShowParents;
  (this->DumpOpts).ShowForm = DumpOpts.ShowForm;
  (this->DumpOpts).SummarizeTypes = DumpOpts.SummarizeTypes;
  (this->DumpOpts).Verbose = DumpOpts.Verbose;
  (this->DumpOpts).DisplayRawContents = DumpOpts.DisplayRawContents;
  *(undefined2 *)&(this->DumpOpts).field_0x16 = DumpOpts._22_2_;
  p_Var1 = &(this->ReferenceToDIEOffsets)._M_t._M_impl.super__Rb_tree_header;
  (this->ReferenceToDIEOffsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ReferenceToDIEOffsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->ReferenceToDIEOffsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->ReferenceToDIEOffsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ReferenceToDIEOffsets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)
   ((long)&(this->ReferenceToDIEOffsets)._M_t._M_impl.super__Rb_tree_header._M_node_count + 6) = 0;
  iVar3 = (*((D->DObj)._M_t.
             super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
             .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
            _vptr_DWARFObject[3])();
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  if (plVar4 != (long *)0x0) {
    bVar2 = (bool)(**(code **)(*plVar4 + 0x188))(plVar4);
    this->IsObjectFile = bVar2;
    this->IsMachOObject = (*(uint *)(plVar4 + 1) & 0xfffffffc) == 0x10;
  }
  return;
}

Assistant:

DWARFVerifier::DWARFVerifier(raw_ostream &S, DWARFContext &D,
                             DIDumpOptions DumpOpts)
    : OS(S), DCtx(D), DumpOpts(std::move(DumpOpts)), IsObjectFile(false),
      IsMachOObject(false) {
  if (const auto *F = DCtx.getDWARFObj().getFile()) {
    IsObjectFile = F->isRelocatableObject();
    IsMachOObject = F->isMachO();
  }
}